

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector3 Vector3Refract(Vector3 v,Vector3 n,float r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector3 VVar6;
  
  fVar3 = v.z * n.z + v.x * n.x + v.y * n.y;
  fVar1 = 1.0 - r * r * (1.0 - fVar3 * fVar3);
  fVar2 = 0.0;
  fVar4 = 0.0;
  fVar5 = 0.0;
  if (0.0 <= fVar1) {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = fVar3 * r + fVar1;
    fVar4 = r * v.x - fVar1 * n.x;
    fVar5 = r * v.y - fVar1 * n.y;
    fVar2 = v.z * r - fVar1 * n.z;
  }
  VVar6.y = fVar5;
  VVar6.x = fVar4;
  VVar6.z = fVar2;
  return VVar6;
}

Assistant:

RMAPI Vector3 Vector3Refract(Vector3 v, Vector3 n, float r)
{
    Vector3 result = { 0 };

    float dot = v.x*n.x + v.y*n.y + v.z*n.z;
    float d = 1.0f - r*r*(1.0f - dot*dot);

    if (d >= 0.0f)
    {
        d = sqrtf(d);
        v.x = r*v.x - (r*dot + d)*n.x;
        v.y = r*v.y - (r*dot + d)*n.y;
        v.z = r*v.z - (r*dot + d)*n.z;

        result = v;
    }

    return result;
}